

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O2

int32_t __thiscall icu_63::UCharsTrie::getValue(UCharsTrie *this)

{
  char16_t cVar1;
  char16_t *pcVar2;
  int32_t iVar3;
  uint uVar4;
  char16_t *pos;
  
  pcVar2 = this->pos_;
  cVar1 = *pcVar2;
  pos = pcVar2 + 1;
  if (cVar1 < L'\0') {
    iVar3 = readValue(pos,(ushort)cVar1 & 0x7fff);
    return iVar3;
  }
  uVar4 = (uint)(ushort)cVar1;
  if ((ushort)cVar1 < 0x4040) {
    return ((int)uVar4 >> 6) + -1;
  }
  if (uVar4 < 0x7fc0) {
    return (uVar4 & 0x7fc0) * 0x400 + (uint)(ushort)*pos + -0x1010000;
  }
  return CONCAT22(*pos,pcVar2[2]);
}

Assistant:

inline int32_t getValue() const {
        const char16_t *pos=pos_;
        int32_t leadUnit=*pos++;
        // U_ASSERT(leadUnit>=kMinValueLead);
        return leadUnit&kValueIsFinal ?
            readValue(pos, leadUnit&0x7fff) : readNodeValue(pos, leadUnit);
    }